

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pair<google::dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>,_bool>
* __thiscall
google::
dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
::insert_noresize<unsigned_long_const&,unsigned_long_const&,int>
          (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
           *this,unsigned_long *key,unsigned_long *args,int *args_1)

{
  pointer in_RSI;
  pair<google::dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>,_bool>
  *in_RDI;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_R8;
  pair<unsigned_long,_unsigned_long> pVar1;
  pair<unsigned_long,_unsigned_long> pos;
  undefined7 in_stack_ffffffffffffff90;
  bool in_stack_ffffffffffffff97;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_ffffffffffffff98;
  dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  bool in_stack_ffffffffffffffb7;
  pointer in_stack_ffffffffffffffc8;
  
  pVar1 = dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
          ::find_position<unsigned_long>
                    ((dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     &in_stack_ffffffffffffffa8->first);
  if (pVar1.first == 0xffffffffffffffff) {
    insert_at<unsigned_long_const&,int>
              (in_R8,pVar1.second,(unsigned_long *)0xffffffffffffffff,
               (int *)in_stack_ffffffffffffffc8);
    std::
    pair<google::dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>,_bool>
    ::
    pair<google::dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>,_bool,_true>
              (in_RDI,(dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                       *)&stack0xffffffffffffff98,(bool *)&stack0xffffffffffffff97);
  }
  else {
    dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
    ::dense_hashtable_iterator
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (pointer)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_RSI,
               SUB81((ulong)in_RDI >> 0x38,0));
    std::
    pair<google::dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>,_bool>
    ::
    pair<google::dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>,_bool,_true>
              (in_RDI,(dense_hashtable_iterator<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                       *)&stack0xffffffffffffffb8,(bool *)&stack0xffffffffffffffb7);
  }
  return in_RDI;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }